

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

ExpandMacroResult
cmCMakePresetsGraphInternal::ExpandMacros
          (string *out,MacroExpanderVector *macroExpanders,int version)

{
  char cVar1;
  bool bVar2;
  ExpandMacroResult EVar3;
  undefined1 *__it;
  char *pcVar4;
  char cVar5;
  char *pcVar6;
  long lVar7;
  string *local_a8;
  string macroNamespace;
  string macroName;
  string result;
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  EVar3 = Ok;
  macroNamespace._M_dataplus._M_p = (pointer)&macroNamespace.field_2;
  macroNamespace._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  macroNamespace.field_2._M_local_buf[0] = '\0';
  macroName._M_dataplus._M_p = (pointer)&macroName.field_2;
  macroName._M_string_length = 0;
  macroName.field_2._M_local_buf[0] = '\0';
  pcVar4 = (out->_M_dataplus)._M_p;
  pcVar6 = pcVar4 + out->_M_string_length;
  for (; pcVar4 != pcVar6; pcVar4 = pcVar4 + 1) {
    cVar1 = *pcVar4;
    if (EVar3 == Error) {
      if (cVar1 == '}') {
        EVar3 = ExpandMacro(&result,&macroNamespace,&macroName,macroExpanders,version);
        if (EVar3 != Ok) goto LAB_0033eea7;
        macroNamespace._M_string_length = 0;
        EVar3 = Ok;
        *macroNamespace._M_dataplus._M_p = '\0';
        macroName._M_string_length = 0;
        *macroName._M_dataplus._M_p = '\0';
      }
      else {
        std::__cxx11::string::push_back((char)&macroName);
        EVar3 = Error;
      }
    }
    else {
      cVar5 = (char)&result;
      if (EVar3 == Ignore) {
        if (cVar1 == '{') {
          __it = (anonymous_namespace)::ValidPrefixes;
          local_a8 = &macroNamespace;
          for (lVar7 = 0x20; lVar7 != 0; lVar7 = lVar7 + -0x20) {
            bVar2 = __gnu_cxx::__ops::
                    _Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                    ::operator()((_Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                  *)&local_a8,(char **)__it);
            if (bVar2) {
              EVar3 = Error;
              if (lVar7 != 0) goto LAB_0033ee50;
              break;
            }
            bVar2 = __gnu_cxx::__ops::
                    _Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                    ::operator()((_Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                  *)&local_a8,(char **)((long)__it + 8));
            if (((bVar2) ||
                (bVar2 = __gnu_cxx::__ops::
                         _Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                         ::operator()((_Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                       *)&local_a8,(char **)((long)__it + 0x10)), bVar2)) ||
               (bVar2 = __gnu_cxx::__ops::
                        _Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                        ::operator()((_Iter_pred<(anonymous_namespace)::IsValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                      *)&local_a8,(char **)((long)__it + 0x18)), bVar2)) {
              EVar3 = Error;
              goto LAB_0033ee50;
            }
            __it = (undefined1 *)((long)__it + 0x20);
          }
          std::__cxx11::string::push_back(cVar5);
          std::__cxx11::string::append((string *)&result);
          std::__cxx11::string::push_back(cVar5);
        }
        else {
          std::__cxx11::string::push_back((char)&macroNamespace);
          local_a8 = &macroNamespace;
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                *)&local_a8,(char **)(anonymous_namespace)::ValidPrefixes);
          if ((((bVar2) ||
               (bVar2 = __gnu_cxx::__ops::
                        _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                        ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                      *)&local_a8,
                                     (char **)((anonymous_namespace)::ValidPrefixes + 8)), bVar2))
              || (bVar2 = __gnu_cxx::__ops::
                          _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                          ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                        *)&local_a8,
                                       (char **)((anonymous_namespace)::ValidPrefixes + 0x10)),
                 bVar2)) ||
             (bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::$_0>
                      ::operator()((_Iter_pred<(anonymous_namespace)::PrefixesValidMacroNamespace(std::__cxx11::string_const&)::__0>
                                    *)&local_a8,
                                   (char **)((anonymous_namespace)::ValidPrefixes + 0x18)), bVar2))
          {
            EVar3 = Ignore;
            goto LAB_0033ee50;
          }
          std::__cxx11::string::push_back(cVar5);
          std::__cxx11::string::append((string *)&result);
        }
        macroNamespace._M_string_length = 0;
        *macroNamespace._M_dataplus._M_p = '\0';
        EVar3 = Ok;
      }
      else {
        EVar3 = Ignore;
        if (cVar1 != '$') {
          EVar3 = Ok;
          std::__cxx11::string::push_back(cVar5);
        }
      }
    }
LAB_0033ee50:
  }
  if (EVar3 != Error) {
    if (EVar3 == Ignore) {
      std::__cxx11::string::push_back((char)&result);
      std::__cxx11::string::append((string *)&result);
    }
    std::__cxx11::string::operator=((string *)out,(string *)&result);
    EVar3 = Ok;
  }
LAB_0033eea7:
  std::__cxx11::string::~string((string *)&macroName);
  std::__cxx11::string::~string((string *)&macroNamespace);
  std::__cxx11::string::~string((string *)&result);
  return EVar3;
}

Assistant:

ExpandMacroResult cmCMakePresetsGraphInternal::ExpandMacros(
  std::string& out, MacroExpanderVector const& macroExpanders, int version)
{
  std::string result;
  std::string macroNamespace;
  std::string macroName;

  enum class State
  {
    Default,
    MacroNamespace,
    MacroName,
  } state = State::Default;

  for (auto c : out) {
    switch (state) {
      case State::Default:
        if (c == '$') {
          state = State::MacroNamespace;
        } else {
          result += c;
        }
        break;

      case State::MacroNamespace:
        if (c == '{') {
          if (IsValidMacroNamespace(macroNamespace)) {
            state = State::MacroName;
          } else {
            result += '$';
            result += macroNamespace;
            result += '{';
            macroNamespace.clear();
            state = State::Default;
          }
        } else {
          macroNamespace += c;
          if (!PrefixesValidMacroNamespace(macroNamespace)) {
            result += '$';
            result += macroNamespace;
            macroNamespace.clear();
            state = State::Default;
          }
        }
        break;

      case State::MacroName:
        if (c == '}') {
          auto e = ExpandMacro(result, macroNamespace, macroName,
                               macroExpanders, version);
          if (e != ExpandMacroResult::Ok) {
            return e;
          }
          macroNamespace.clear();
          macroName.clear();
          state = State::Default;
        } else {
          macroName += c;
        }
        break;
    }
  }

  switch (state) {
    case State::Default:
      break;
    case State::MacroNamespace:
      result += '$';
      result += macroNamespace;
      break;
    case State::MacroName:
      return ExpandMacroResult::Error;
  }

  out = std::move(result);
  return ExpandMacroResult::Ok;
}